

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O2

pboolean p_socket_address_is_scope_id_supported(void)

{
  return 1;
}

Assistant:

P_LIB_API pboolean
p_socket_address_is_scope_id_supported (void)
{
#ifdef AF_INET6
#  ifdef PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID
	return TRUE;
#  else
	return FALSE;
#  endif
#else
	return FALSE;
#endif
}